

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numGuess.cpp
# Opt level: O3

int main(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  char playAgain;
  int magicNumber;
  int guess;
  char local_3d;
  int local_3c;
  int local_38;
  int local_34;
  
  local_3d = 'n';
  do {
    local_3c = 0;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"Welcome to the number guessing game!",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Player 1: Please enter an integer between ",0x2a);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," and ",5);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,100);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," (inclusive).",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Floats will always be rounded down.",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    while (local_3c - 0x65U < 0xffffff9c) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Number please: ",0xf);
      std::istream::operator>>((istream *)&std::cin,&local_3c);
      if (0xffffff9b < local_3c - 0x65U) break;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Number is out of bounds. Please try again",0x29);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
      std::ostream::put('8');
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Player 2: Please guess the number that player 1 chose.",0x36);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    iVar3 = 1;
    iVar11 = 100;
    iVar10 = -1;
    iVar8 = 0;
    do {
      local_38 = 0;
      local_34 = iVar10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"You have ",9);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,3 - iVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," guesses remaining.",0x13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Please choose a number between ",0x1f);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," and ",5);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,".\n",2);
      if (local_38 < iVar3 || iVar11 < local_38) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," - ",3);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"): ",3);
          std::istream::operator>>((istream *)&std::cin,&local_38);
          if (local_38 < iVar3 || iVar11 < local_38) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Number is out of bounds. Please try again",0x29);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
            std::ostream::put('8');
            std::ostream::flush();
          }
        } while (iVar11 < local_38 || local_38 < iVar3);
      }
      iVar2 = local_34;
      if (local_38 < local_3c) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Your guess was too low!",0x17);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
        std::ostream::put('8');
        std::ostream::flush();
        iVar3 = local_38 + 1;
      }
      else {
        if (local_38 <= local_3c) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Congrats! You won!",0x12);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
          cVar9 = '8';
          goto LAB_00101782;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Your guess was too high!",0x18);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
        std::ostream::put('8');
        std::ostream::flush();
        iVar11 = local_38 + -1;
      }
      iVar10 = local_38;
      if (iVar2 != -1) {
        uVar7 = local_3c - iVar2;
        uVar1 = -uVar7;
        if (0 < (int)uVar7) {
          uVar1 = uVar7;
        }
        uVar6 = local_3c - local_38;
        uVar7 = -uVar6;
        if (0 < (int)uVar6) {
          uVar7 = uVar6;
        }
        iVar10 = iVar2;
        if (uVar7 < uVar1) {
          iVar10 = local_38;
        }
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != 3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Player 2 lost. Player 1 had number ",0x23);
    plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_3c);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Player 2\'s closest guess was ",0x1d);
    plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
    cVar9 = (char)plVar5;
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + cVar9);
LAB_00101782:
    std::ostream::put(cVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Enter \'y\' to play again: ",0x19);
    std::operator>>((istream *)&std::cin,&local_3d);
    iVar3 = tolower((int)local_3d);
    if (iVar3 != 0x79) {
      return 0;
    }
  } while( true );
}

Assistant:

int main()
{
    const int NUM_GUESSES = 3;
    const int MIN_NUMBER = 1;
    const int MAX_NUMBER = 100;

    char playAgain = 'n';

    do
    {
        int magicNumber = MIN_NUMBER - 1;

        cout << endl << "Welcome to the number guessing game!" << endl;
        cout << endl;
        cout << "Player 1: Please enter an integer between " << MIN_NUMBER <<
                " and " << MAX_NUMBER << " (inclusive)." << endl;
        cout << "Floats will always be rounded down." << endl;

        while(outOfBounds(magicNumber, MIN_NUMBER, MAX_NUMBER))
        {

            cout << "Number please: ";
            cin >> magicNumber;

            if(outOfBounds(magicNumber, MIN_NUMBER, MAX_NUMBER))
            {
                cout << "Number is out of bounds. Please try again" << endl;
            }
        }

        // Guessing section
        int lowerBound = MIN_NUMBER;
        int upperBound = MAX_NUMBER;
        bool numGuessed = false;
        int closestGuess = -1;

        cout << "Player 2: Please guess the number that player 1 chose." << endl;

        for (int i = 0; i < NUM_GUESSES; i++)
        {

            int guess = MIN_NUMBER - 1;
            int remainingGuesses = NUM_GUESSES - i;


            cout << "You have " << remainingGuesses << " guesses remaining." << endl;
            cout << "Please choose a number between " << lowerBound << " and " << upperBound << ".\n";

            while(outOfBounds(guess, lowerBound, upperBound))
            {
                cout << "(" << lowerBound << " - " << upperBound << "): ";
                cin >> guess;

                if(outOfBounds(guess, lowerBound, upperBound))
                {
                    cout << "Number is out of bounds. Please try again" << endl;
                }
            }

            if(guess < magicNumber)
            {
                cout << "Your guess was too low!" << endl;
                lowerBound = guess + 1;

                if(closestGuess == -1)
                {
                    closestGuess = guess;
                }
                else
                {
                    if(abs(magicNumber - closestGuess) > abs(magicNumber - guess))
                    {
                        closestGuess = guess;
                    }
                }
            }
            else if(guess > magicNumber)
            {
                cout << "Your guess was too high!" << endl;
                upperBound = guess - 1;

                if(closestGuess == -1)
                {
                    closestGuess = guess;
                }
                else
                {
                    if(abs(magicNumber - closestGuess) > abs(magicNumber - guess))
                    {
                        closestGuess = guess;
                    }
                }
            }
            else
            {
                cout << "Congrats! You won!" << endl;
                numGuessed = true;
                break;
            }
        }

        if(!numGuessed)
        {
            cout << "Player 2 lost. Player 1 had number " << magicNumber << endl;
            cout << "Player 2's closest guess was " << closestGuess << endl;
        }

        cout << "Enter 'y' to play again: ";
        cin >> playAgain;

    } while (tolower(playAgain) == 'y');

    return 0;
}